

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_8::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  IteratorWrapper *in_RDI;
  Iterator *unaff_retaddr;
  
  in_RDI->iter_ = (Iterator *)&PTR__TwoLevelIterator_0012c5e0;
  std::__cxx11::string::~string((string *)&in_RDI[4].key_.size_);
  IteratorWrapper::~IteratorWrapper(in_RDI);
  IteratorWrapper::~IteratorWrapper(in_RDI);
  Status::~Status((Status *)in_RDI);
  Iterator::~Iterator(unaff_retaddr);
  return;
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;